

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textdefs.c
# Opt level: O1

void str_int_impl(uchar **s,uint64_t x)

{
  uchar *puVar1;
  bool bVar2;
  uint8_t *puVar3;
  long lVar4;
  uint64_t t;
  uint64_t uVar5;
  
  puVar1 = *s;
  puVar1[0] = '0';
  puVar1[1] = 'x';
  puVar3 = puVar1 + 2;
  if (x == 0) {
    *puVar3 = '0';
    puVar3 = *s + 3;
  }
  else {
    lVar4 = 4;
    uVar5 = x;
    do {
      lVar4 = lVar4 + 4;
      bVar2 = 0xf < uVar5;
      uVar5 = uVar5 >> 4;
    } while (bVar2);
    do {
      *puVar3 = "0123456789abcdef"[(uint)(x >> ((char)lVar4 - 8U & 0x3f)) & 0xf];
      puVar3 = puVar3 + 1;
      lVar4 = lVar4 + -4;
    } while (4 < lVar4);
  }
  *s = puVar3;
  return;
}

Assistant:

void str_int_impl(unsigned char** s, uint64_t x)
{
	int8_t* buf;
	int shift = 0;
	OFFSET_INTEGER t = x;

	buf = (int8_t*)*s;

	*buf++ = '0';
	*buf++ = 'x';

	if (x == 0) {
		*buf = '0';
		*s += 3;
		return;
	}

	do {
		t >>= 4;
		shift += 4;
	} while (t);

	do {
		shift -= 4;
		t = (x >> shift) & 0xf;
		*buf++ = NIBBLE_TO_CHR;
	} while (shift > 0);

	*s = (unsigned char*)buf;
}